

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_remove_input(wally_psbt *psbt,uint32_t index)

{
  wally_tx *tx;
  int iVar1;
  undefined1 free_parent;
  ulong uVar2;
  
  free_parent = (undefined1)index;
  iVar1 = -2;
  if (((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
     (tx->num_inputs == psbt->num_inputs)) {
    uVar2 = (ulong)index;
    iVar1 = wally_tx_remove_input(tx,uVar2);
    free_parent = (undefined1)uVar2;
  }
  if (iVar1 == 0) {
    uVar2 = (ulong)index;
    psbt_input_free(psbt->inputs + uVar2,(_Bool)free_parent);
    memmove(psbt->inputs + uVar2,psbt->inputs + uVar2 + 1,(~uVar2 + psbt->num_inputs) * 0x110);
    psbt->num_inputs = psbt->num_inputs - 1;
  }
  return iVar1;
}

Assistant:

int wally_psbt_remove_input(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_input(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_input_free(&psbt->inputs[index], false);
        memmove(psbt->inputs + index, psbt->inputs + index + 1,
                (psbt->num_inputs - index - 1) * sizeof(struct wally_psbt_input));
        psbt->num_inputs -= 1;
    }
    return ret;
}